

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O1

list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> * __thiscall
evaluator::Evaluator::evalProgram_abi_cxx11_
          (list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
           *__return_storage_ptr__,Evaluator *this,Program *program,Env *env)

{
  size_t *psVar1;
  undefined8 *puVar2;
  _List_node_base *in_RAX;
  long lVar3;
  _List_node_base *p_Var4;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar5;
  undefined8 *puVar6;
  GCPtr<symbols::Object> result;
  GCPtr<symbols::Object> local_38;
  
  (__return_storage_ptr__->
  super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>)._M_impl.
  _M_node._M_size = 0;
  puVar6 = *(undefined8 **)(this + 0x10);
  puVar2 = *(undefined8 **)(this + 0x18);
  local_38.addr = (Object *)in_RAX;
  do {
    if (puVar6 == puVar2) {
      return __return_storage_ptr__;
    }
    Eval((Evaluator *)&local_38,(Node *)*puVar6,(Env *)program);
    if ((_List_node_base *)local_38.addr == (_List_node_base *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(local_38.addr,&symbols::Object::typeinfo,
                             &symbols::ReturnObject::typeinfo,0);
    }
    if (lVar3 != 0) {
      GCPtr<symbols::Object>::operator=(&local_38,*(Object **)(lVar3 + 0x10));
    }
    p_Var4 = (_List_node_base *)operator_new(0x18);
    plVar5 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar5 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               (plVar5->
               super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>)
               ._M_impl._M_node.super__List_node_base._M_next;
      if (plVar5 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (*(_List_node_base **)((long)plVar5 + 0x10U + 8) != (_List_node_base *)local_38.addr);
    *(int *)((long)plVar5 + 0x10U) = *(int *)((long)plVar5 + 0x10U) + 1;
    p_Var4[1]._M_next = (_List_node_base *)local_38.addr;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(__return_storage_ptr__->
              super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    GCPtr<symbols::Object>::~GCPtr(&local_38);
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

list<GCPtr<Object>> Evaluator::evalProgram(Program *program, Env* env){
    list<GCPtr<Object>> evaluatedStmts;
    for(auto stmt : program->Stmts){
        auto result = Eval(stmt, env);
        if(auto res = dynamic_cast<ReturnObject*>(result.raw())){
            result =  res->value;
        }
        evaluatedStmts.push_back(result);
    }
    return evaluatedStmts;
}